

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cross_list_graph.c
# Opt level: O2

void dfsTraversal_CLG(ClgGraph clgGraph)

{
  uint uVar1;
  size_t __size;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  _Bool *p_Var6;
  _Bool *p_Var7;
  _Bool *p_Var8;
  _Bool *visited;
  int i;
  long lVar9;
  code *pcStack_30;
  _Bool a_Stack_28 [8];
  
  if (clgGraph != (ClgGraph)0x0) {
    uVar1 = clgGraph->vertexSize;
    uVar3 = (ulong)uVar1;
    lVar2 = -(uVar3 + 0xf & 0xfffffffffffffff0);
    visited = a_Stack_28 + lVar2;
    uVar4 = 0;
    uVar5 = 0;
    if (0 < (int)uVar1) {
      uVar5 = (ulong)uVar1;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      visited[uVar4] = false;
    }
    for (lVar9 = 0; lVar9 < (int)uVar3; lVar9 = lVar9 + 1) {
      if (visited[lVar9] == false) {
        p_Var6 = a_Stack_28 + lVar2 + -8;
        p_Var6[0] = true;
        p_Var6[1] = true;
        p_Var6[2] = true;
        p_Var6[3] = false;
        p_Var6[4] = false;
        p_Var6[5] = false;
        p_Var6[6] = false;
        p_Var6[7] = false;
        dfs_CLG(clgGraph,visited,(int)lVar9);
        uVar3 = (ulong)(uint)clgGraph->vertexSize;
      }
    }
    p_Var7 = a_Stack_28 + lVar2 + -8;
    p_Var7[0] = true;
    p_Var7[1] = false;
    p_Var7[2] = false;
    p_Var7[3] = false;
    p_Var7[4] = false;
    p_Var7[5] = false;
    p_Var7[6] = false;
    p_Var7[7] = false;
    __size = *(size_t *)(a_Stack_28 + lVar2 + -8);
    p_Var8 = a_Stack_28 + lVar2 + -8;
    p_Var8[0] = true;
    p_Var8[1] = false;
    p_Var8[2] = false;
    p_Var8[3] = false;
    p_Var8[4] = false;
    p_Var8[5] = false;
    p_Var8[6] = false;
    p_Var8[7] = false;
    fwrite(anon_var_dwarf_603e + 0x42,__size,*(size_t *)(a_Stack_28 + lVar2 + -8),_stdout);
    return;
  }
  pcStack_30 = dfs_CLG;
  __assert_fail("clgGraph",
                "/workspace/llm4binary/github/license_all_cmakelists_25/determinelcl[P]data-structure/graph/cross_list_graph.c"
                ,0x126,"void dfsTraversal_CLG(ClgGraph)");
}

Assistant:

void dfsTraversal_CLG(ClgGraph clgGraph) {
    assert(clgGraph);
    bool visited[clgGraph->vertexSize];

    for (int i = 0; i < clgGraph->vertexSize; ++i)
        visited[i] = false;

    for (int i = 0; i < clgGraph->vertexSize; ++i) {
        if (visited[i]) continue;
        dfs_CLG(clgGraph, visited, i);
    }
    fprintf(stdout, "\n\n");
}